

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Decode.cpp
# Opt level: O3

void idx2::DecompressBufZstd(buffer *Input,bitstream *Output)

{
  int iVar1;
  long lVar2;
  unsigned_long_long dstCapacity;
  size_t sVar3;
  int iVar4;
  long lVar5;
  i64 unaff_R13;
  buffer local_48;
  
  dstCapacity = ZSTD_getFrameContentSize(Input->Data,Input->Bytes);
  lVar2 = (Output->Stream).Bytes;
  lVar5 = lVar2;
  if ((long)(dstCapacity + 8) < lVar2) goto LAB_001775f1;
  do {
    unaff_R13 = (lVar5 * 3) / 2;
    lVar5 = unaff_R13 + 8;
  } while (unaff_R13 <= (long)dstCapacity);
  if (unaff_R13 + 8 <= lVar2) goto LAB_001775f1;
  unaff_R13 = unaff_R13 + 0x10;
  if (Mallocator()::Instance == '\0') goto LAB_0017761b;
  while( true ) {
    local_48.Data = (byte *)0x0;
    local_48.Bytes = 0;
    local_48.Alloc = (allocator *)&Mallocator()::Instance;
    AllocBuf(&local_48,unaff_R13,(Output->Stream).Alloc);
    iVar1 = Output->BitPos + 7;
    iVar4 = Output->BitPos + 0xe;
    if (-1 < iVar1) {
      iVar4 = iVar1;
    }
    MemCopy(&Output->Stream,&local_48,
            (u64)(Output->BitPtr + ((long)(iVar4 >> 3) - (long)(Output->Stream).Data)));
    Output->BitPtr = local_48.Data + ((long)Output->BitPtr - (long)(Output->Stream).Data);
    DeallocBuf(&Output->Stream);
    (Output->Stream).Alloc = local_48.Alloc;
    (Output->Stream).Data = local_48.Data;
    (Output->Stream).Bytes = local_48.Bytes;
LAB_001775f1:
    sVar3 = ZSTD_decompress((Output->Stream).Data,dstCapacity,Input->Data,Input->Bytes);
    if (sVar3 == dstCapacity) break;
    DecompressBufZstd();
LAB_0017761b:
    DecompressBufZstd();
  }
  return;
}

Assistant:

void
DecompressBufZstd(const buffer& Input, bitstream* Output)
{
  unsigned long long const OutputSize = ZSTD_getFrameContentSize(Input.Data, Size(Input));
  GrowToAccomodate(Output, OutputSize - Size(*Output));
  size_t const Result = ZSTD_decompress(Output->Stream.Data, OutputSize, Input.Data, Size(Input));
  if (Result != OutputSize)
  {
    fprintf(stderr, "Zstd decompression failed\n");
    exit(1);
  }
}